

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O3

void final_scene(int image_width,int samples_per_pixel,int max_depth)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  pointer psVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  shared_ptr<lambertian> emat;
  shared_ptr<noise_texture> pertext;
  shared_ptr<lambertian> white;
  shared_ptr<lambertian> ground;
  shared_ptr<lambertian> sphere_material;
  shared_ptr<diffuse_light> light;
  shared_ptr<dielectric> local_4a8;
  sphere *local_498;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_490 [2];
  shared_ptr<dielectric> local_480;
  undefined1 local_469;
  shared_ptr<noise_texture> local_468;
  hittable_list local_458;
  shared_ptr<lambertian> local_408;
  shared_ptr<rotate_y> local_3f8;
  int local_3e4;
  int local_3e0;
  int local_3dc;
  vec3 local_3d8;
  shared_ptr<bvh_node> local_3b8;
  lambertian *local_3a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3a0;
  shared_ptr<hittable> local_398;
  shared_ptr<lambertian> local_388;
  lambertian *local_378;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_370;
  hittable_list local_368;
  shared_ptr<hittable> local_318;
  shared_ptr<hittable> local_308;
  ulong local_2f0;
  _func_int **local_2e8;
  sphere *local_2e0;
  double local_2d8;
  shared_ptr<diffuse_light> local_2d0;
  int local_2bc;
  shared_ptr<hittable> local_2b8;
  shared_ptr<hittable> local_2a8;
  shared_ptr<hittable> local_298;
  shared_ptr<hittable> local_288;
  shared_ptr<hittable> local_278;
  shared_ptr<hittable> local_268;
  shared_ptr<hittable> local_258;
  shared_ptr<hittable> local_248;
  shared_ptr<hittable> local_238;
  shared_ptr<hittable> local_228;
  vec3 local_218;
  undefined1 local_1f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1f0;
  double local_1e8;
  double local_1e0;
  double dStack_1d8;
  double local_1d0;
  double local_1c8;
  double dStack_1c0;
  double local_1b8;
  double dStack_1b0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  double local_180;
  double dStack_178;
  double local_170;
  undefined1 local_158 [216];
  hittable_list local_80;
  
  local_80.super_hittable._vptr_hittable = (_func_int **)&PTR__hittable_list_001283e8;
  local_80.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar5 = 0;
  local_80.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80.bbox.x.min = INFINITY;
  local_80.bbox.x.max = -INFINITY;
  local_80.bbox.y.min = INFINITY;
  local_80.bbox.y.max = -INFINITY;
  local_80.bbox.z.min = INFINITY;
  local_80.bbox.z.max = -INFINITY;
  local_1f8 = (undefined1  [8])0x3fdeb851eb851eb8;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fea8f5c28f5c28f;
  local_1e8 = 0.53;
  local_3a8 = (lambertian *)0x0;
  local_3e4 = image_width;
  local_3e0 = samples_per_pixel;
  local_3dc = max_depth;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,vec3>
            (&local_3a0,&local_3a8,(allocator<lambertian> *)&local_368,(vec3 *)local_1f8);
  do {
    local_2e0 = (sphere *)((double)(int)uVar5 * 100.0 + -1000.0);
    local_2e8 = (_func_int **)((double)local_2e0 + 100.0);
    iVar3 = 0;
    local_2f0 = uVar5;
    do {
      local_2d8 = (double)iVar3 * 100.0 + -1000.0;
      iVar2 = rand();
      local_368.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)((double)iVar2 * 4.656612873077393e-10 * 100.0 + 1.0);
      local_1f8 = (undefined1  [8])local_2e0;
      _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1e8 = local_2d8;
      local_368.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)(local_2d8 + 100.0);
      local_368.super_hittable._vptr_hittable = local_2e8;
      local_378 = local_3a8;
      local_370 = local_3a0._M_pi;
      if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_3a0._M_pi)->_M_use_count = (local_3a0._M_pi)->_M_use_count + 1;
        }
      }
      box((point3 *)&local_458,(point3 *)local_1f8,(shared_ptr<material> *)&local_368);
      local_308.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_458.super_hittable._vptr_hittable;
      local_308.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_458.objects.
           super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
      local_458.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      hittable_list::add(&local_80,&local_308);
      if (local_308.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_308.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_458.objects.
          super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_458.objects.
                   super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_370 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_370);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0x14);
    uVar4 = (int)local_2f0 + 1;
    uVar5 = (ulong)uVar4;
  } while (uVar4 != 0x14);
  local_368.super_hittable._vptr_hittable = (_func_int **)&PTR__hittable_list_001283e8;
  local_368.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_368.bbox.x.min = INFINITY;
  local_368.bbox.x.max = -INFINITY;
  local_368.bbox.y.min = INFINITY;
  local_368.bbox.y.max = -INFINITY;
  local_368.bbox.z.min = INFINITY;
  local_368.bbox.z.max = -INFINITY;
  local_1f8 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<bvh_node,std::allocator<bvh_node>,hittable_list&>
            (&_Stack_1f0,(bvh_node **)local_1f8,(allocator<bvh_node> *)&local_458,&local_80);
  local_228.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1f8;
  local_228.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_1f0._M_pi;
  local_1f8 = (undefined1  [8])0x0;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hittable_list::add(&local_368,&local_228);
  if (local_228.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_228.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (_Stack_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1f0._M_pi);
  }
  local_1f8 = (undefined1  [8])0x401c000000000000;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x401c000000000000;
  local_1e8 = 7.0;
  local_2d0.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<diffuse_light,std::allocator<diffuse_light>,vec3>
            (&local_2d0.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (diffuse_light **)&local_2d0,(allocator<diffuse_light> *)&local_458,(vec3 *)local_1f8);
  local_1f8 = (undefined1  [8])0x405ec00000000000;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4081500000000000;
  local_1e8 = 147.0;
  local_458.super_hittable._vptr_hittable = (_func_int **)0x4072c00000000000;
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.e[0] = 0.0;
  local_218.e[1] = 0.0;
  local_218.e[2] = 265.0;
  local_3d8.e[0] = 0.0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<quad,std::allocator<quad>,vec3,vec3,vec3,std::shared_ptr<diffuse_light>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_3d8.e + 1),(quad **)&local_3d8,
             (allocator<quad> *)&local_388,(vec3 *)local_1f8,(vec3 *)&local_458,&local_218,
             &local_2d0);
  local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_3d8.e[0];
  local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8.e[1];
  local_3d8.e[0] = 0.0;
  local_3d8.e[1] = 0.0;
  hittable_list::add(&local_368,&local_238);
  if (local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_238.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8.e[1] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d8.e[1]);
  }
  local_218.e[0] = 400.0;
  local_218.e[1] = 400.0;
  local_218.e[2] = 200.0;
  local_3d8.e[0] = 430.0;
  local_3d8.e[1] = 400.0;
  local_3d8.e[2] = 200.0;
  local_1f8 = (undefined1  [8])0x3fe6666666666666;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fd3333333333333;
  local_1e8 = 0.1;
  local_388.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,vec3>
            (&local_388.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&local_388,(allocator<lambertian> *)&local_458,(vec3 *)local_1f8);
  local_458.super_hittable._vptr_hittable._0_4_ = 0x32;
  local_1f8 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3&,vec3&,int,std::shared_ptr<lambertian>&>
            (&_Stack_1f0,(sphere **)local_1f8,(allocator<sphere> *)&local_4a8,&local_218,&local_3d8,
             (int *)&local_458,&local_388);
  local_248.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1f8;
  local_248.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_1f0._M_pi;
  local_1f8 = (undefined1  [8])0x0;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hittable_list::add(&local_368,&local_248);
  if (local_248.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_248.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (_Stack_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1f0._M_pi);
  }
  local_1f8 = (undefined1  [8])0x4070400000000000;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4062c00000000000;
  local_1e8 = 45.0;
  local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                0x32);
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00128868;
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__material_001288b8;
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 0;
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0x3ff80000;
  local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<dielectric>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_458.objects,(sphere **)&local_458,
             (allocator<sphere> *)&local_468,(vec3 *)local_1f8,(int *)&local_480,&local_4a8);
  local_258.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_458.super_hittable._vptr_hittable;
  local_258.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_458.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  hittable_list::add(&local_368,&local_258);
  if (local_258.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_258.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_458.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_458.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_1f8 = (undefined1  [8])0x0;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4062c00000000000;
  local_1e8 = 145.0;
  local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                0x32);
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001287d0;
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__material_00128820;
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = -0x66666666;
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0x3fe99999;
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _vptr__Sp_counted_base = (_func_int **)0x3fe999999999999a;
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_use_count = -0x33333333;
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2].
  _M_weak_count = 0x3feccccc;
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[3].
  _vptr__Sp_counted_base = (_func_int **)0x3ff0000000000000;
  local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<metal>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_458.objects,(sphere **)&local_458,
             (allocator<sphere> *)&local_468,(vec3 *)local_1f8,(int *)&local_480,
             (shared_ptr<metal> *)&local_4a8);
  local_268.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_458.super_hittable._vptr_hittable;
  local_268.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_458.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  hittable_list::add(&local_368,&local_268);
  if (local_268.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_458.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_458.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_1f8 = (undefined1  [8])0x4076800000000000;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4062c00000000000;
  local_1e8 = 145.0;
  local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,
                0x46);
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_00128868;
  local_458.super_hittable._vptr_hittable =
       (_func_int **)
       ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_458.objects.
        super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
        _M_impl.super__Vector_impl_data._M_start + 1);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start)[1]._vptr__Sp_counted_base =
       (_func_int **)&PTR__material_001288b8;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start)[1]._M_use_count = 0;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start)[1]._M_weak_count = 0x3ff80000;
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<dielectric>>
            (&local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (sphere **)&local_4a8,(allocator<sphere> *)&local_468,(vec3 *)local_1f8,
             (int *)&local_480,(shared_ptr<dielectric> *)&local_458);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_458.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_458.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  local_398.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_398.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  hittable_list::add(&local_368,&local_398);
  if (local_398.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_398.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x3fc999999999999a;
  local_1f8 = (undefined1  [8])0x3fc999999999999a;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fd999999999999a;
  local_1e8 = 0.9;
  local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<constant_medium,std::allocator<constant_medium>,std::shared_ptr<sphere>&,double,vec3>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_458.objects,
             (constant_medium **)&local_458,(allocator<constant_medium> *)&local_468,
             (shared_ptr<sphere> *)&local_4a8,(double *)&local_480,(vec3 *)local_1f8);
  local_278.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_458.super_hittable._vptr_hittable;
  local_278.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_458.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  hittable_list::add(&local_368,&local_278);
  if (local_278.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_278.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_458.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_458.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  local_1f8 = (undefined1  [8])0x0;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1e8 = 0.0;
  local_468.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_468.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_
                ,5000);
  local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00128868;
  local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__material_001288b8;
  local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_use_count = 0;
  local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _M_weak_count = 0x3ff80000;
  local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<dielectric>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_458.objects,(sphere **)&local_458,
             (allocator<sphere> *)&local_408,(vec3 *)local_1f8,(int *)&local_468,&local_480);
  psVar1 = local_458.objects.
           super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_458.super_hittable._vptr_hittable;
  this._M_pi = local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar1;
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_458.objects.
        super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_458.objects.
                 super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x3f1a36e2eb1c432d;
  local_1f8 = (undefined1  [8])0x3ff0000000000000;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3ff0000000000000;
  local_1e8 = 1.0;
  local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<constant_medium,std::allocator<constant_medium>,std::shared_ptr<sphere>&,double,vec3>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_458.objects,
             (constant_medium **)&local_458,(allocator<constant_medium> *)&local_468,
             (shared_ptr<sphere> *)&local_4a8,(double *)&local_480,(vec3 *)local_1f8);
  local_288.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_458.super_hittable._vptr_hittable;
  local_288.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_458.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  hittable_list::add(&local_368,&local_288);
  if (local_288.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_288.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_458.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_458.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  local_1f8 = (undefined1  [8])0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<image_texture,std::allocator<image_texture>,char_const(&)[13]>
            (&_Stack_1f0,(image_texture **)local_1f8,(allocator<image_texture> *)&local_458,
             (char (*) [13])"earthmap.jpg");
  local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<image_texture>>
            (&local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&local_480,(allocator<lambertian> *)&local_458,
             (shared_ptr<image_texture> *)local_1f8);
  if (_Stack_1f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1f0._M_pi);
  }
  local_1f8 = (undefined1  [8])0x4079000000000000;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4069000000000000;
  local_1e8 = 400.0;
  local_468.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(local_468.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_
                ,100);
  local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_458.objects,(sphere **)&local_458,
             (allocator<sphere> *)&local_408,(vec3 *)local_1f8,(int *)&local_468,
             (shared_ptr<lambertian> *)&local_480);
  local_298.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_458.super_hittable._vptr_hittable;
  local_298.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_458.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  hittable_list::add(&local_368,&local_298);
  if (local_298.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_298.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_458.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_458.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  local_1f8 = (undefined1  [8])0x3fc999999999999a;
  local_468.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<noise_texture,std::allocator<noise_texture>,double>
            (&local_468.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (noise_texture **)&local_468,(allocator<noise_texture> *)&local_458,(double *)local_1f8
            );
  local_1f8 = (undefined1  [8])0x406b800000000000;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4071800000000000;
  local_1e8 = 300.0;
  local_498 = (sphere *)CONCAT44(local_498._4_4_,0x50);
  local_408.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,std::shared_ptr<noise_texture>&>
            (&local_408.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&local_408,(allocator<lambertian> *)&local_3f8,&local_468);
  local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_458.objects,(sphere **)&local_458,
             (allocator<sphere> *)&local_3f8,(vec3 *)local_1f8,(int *)&local_498,&local_408);
  local_2a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_458.super_hittable._vptr_hittable;
  local_2a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_458.objects.
       super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_458.super_hittable._vptr_hittable = (_func_int **)0x0;
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  hittable_list::add(&local_368,&local_2a8);
  if (local_2a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2a8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_458.objects.
      super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_458.objects.
               super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_408.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_408.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_458.super_hittable._vptr_hittable = (_func_int **)&PTR__hittable_list_001283e8;
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458.objects.
  super__Vector_base<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_458.bbox.x.min = INFINITY;
  local_458.bbox.x.max = -INFINITY;
  local_458.bbox.y.min = INFINITY;
  local_458.bbox.y.max = -INFINITY;
  local_458.bbox.z.min = INFINITY;
  local_458.bbox.z.max = -INFINITY;
  local_1f8 = (undefined1  [8])0x3fe75c28f5c28f5c;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3fe75c28f5c28f5c;
  local_1e8 = 0.73;
  local_408.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lambertian,std::allocator<lambertian>,vec3>
            (&local_408.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (lambertian **)&local_408,(allocator<lambertian> *)&local_498,(vec3 *)local_1f8);
  iVar3 = 1000;
  do {
    vec3::random();
    local_3f8.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(local_3f8.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,10
                 );
    local_498 = (sphere *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<sphere,std::allocator<sphere>,vec3,int,std::shared_ptr<lambertian>&>
              (a_Stack_490,&local_498,(allocator<sphere> *)&local_3b8,(vec3 *)local_1f8,
               (int *)&local_3f8,&local_408);
    local_318.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_498->super_hittable;
    local_318.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a_Stack_490[0]._M_pi;
    local_498 = (sphere *)0x0;
    a_Stack_490[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    hittable_list::add(&local_458,&local_318);
    if (local_318.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_318.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (a_Stack_490[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_490[0]._M_pi);
    }
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  local_3b8.super___shared_ptr<bvh_node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<bvh_node,std::allocator<bvh_node>,hittable_list&>
            (&local_3b8.super___shared_ptr<bvh_node,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (bvh_node **)&local_3b8,(allocator<bvh_node> *)local_1f8,&local_458);
  local_2bc = 0xf;
  local_3f8.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<rotate_y,std::allocator<rotate_y>,std::shared_ptr<bvh_node>,int>
            (&local_3f8.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (rotate_y **)&local_3f8,(allocator<rotate_y> *)local_1f8,&local_3b8,&local_2bc);
  local_1f8 = (undefined1  [8])0xc059000000000000;
  _Stack_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4070e00000000000;
  local_1e8 = 395.0;
  local_498 = (sphere *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<translate,std::allocator<translate>,std::shared_ptr<rotate_y>,vec3>
            (a_Stack_490,(translate **)&local_498,(allocator<translate> *)&local_469,&local_3f8,
             (vec3 *)local_1f8);
  local_2b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_498->super_hittable;
  local_2b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_490[0]._M_pi;
  local_498 = (sphere *)0x0;
  a_Stack_490[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  hittable_list::add(&local_368,&local_2b8);
  if (local_2b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b8.super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (a_Stack_490[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_490[0]._M_pi);
  }
  if (local_3f8.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f8.super___shared_ptr<rotate_y,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if (local_3b8.super___shared_ptr<bvh_node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3b8.super___shared_ptr<bvh_node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  local_170 = 10.0;
  memset(local_158,0,0xd8);
  local_1f8 = (undefined1  [8])0x3ff0000000000000;
  _Stack_1f0._M_pi._4_4_ = local_3e0;
  _Stack_1f0._M_pi._0_4_ = local_3e4;
  local_1e8 = (double)CONCAT44(local_1e8._4_4_,local_3dc);
  local_1e0 = 0.0;
  dStack_1d8 = 0.0;
  local_1d0 = 0.0;
  local_1c8 = 40.0;
  dStack_1c0 = 478.0;
  local_1b8 = 278.0;
  dStack_1b0 = -600.0;
  local_1a8 = 278.0;
  dStack_1a0 = 278.0;
  local_198 = 0.0;
  dStack_190 = 0.0;
  local_188 = 1.0;
  local_180 = 0.0;
  dStack_178 = 0.0;
  camera::render((camera *)local_1f8,&local_368.super_hittable);
  if (local_408.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_408.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_458.super_hittable._vptr_hittable = (_func_int **)&PTR__hittable_list_001283e8;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::~vector
            (&local_458.objects);
  if (local_468.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_468.super___shared_ptr<noise_texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_480.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_4a8.super___shared_ptr<dielectric,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_388.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_388.super___shared_ptr<lambertian,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_2d0.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2d0.super___shared_ptr<diffuse_light,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  local_368.super_hittable._vptr_hittable = (_func_int **)&PTR__hittable_list_001283e8;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::~vector
            (&local_368.objects);
  if (local_3a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3a0._M_pi);
  }
  local_80.super_hittable._vptr_hittable = (_func_int **)&PTR__hittable_list_001283e8;
  std::vector<std::shared_ptr<hittable>,_std::allocator<std::shared_ptr<hittable>_>_>::~vector
            (&local_80.objects);
  return;
}

Assistant:

void final_scene(int image_width, int samples_per_pixel, int max_depth) {
    hittable_list boxes1;
    auto ground = make_shared<lambertian>(color(0.48, 0.83, 0.53));

    int boxes_per_side = 20;
    for (int i = 0; i < boxes_per_side; i++) {
        for (int j = 0; j < boxes_per_side; j++) {
            auto w = 100.0;
            auto x0 = -1000.0 + i*w;
            auto z0 = -1000.0 + j*w;
            auto y0 = 0.0;
            auto x1 = x0 + w;
            auto y1 = random_double(1,101);
            auto z1 = z0 + w;

            boxes1.add(box(point3(x0,y0,z0), point3(x1,y1,z1), ground));
        }
    }

    hittable_list world;

    world.add(make_shared<bvh_node>(boxes1));

    auto light = make_shared<diffuse_light>(color(7, 7, 7));
    world.add(make_shared<quad>(point3(123,554,147), vec3(300,0,0), vec3(0,0,265), light));

    auto center1 = point3(400, 400, 200);
    auto center2 = center1 + vec3(30,0,0);
    auto sphere_material = make_shared<lambertian>(color(0.7, 0.3, 0.1));
    world.add(make_shared<sphere>(center1, center2, 50, sphere_material));

    world.add(make_shared<sphere>(point3(260, 150, 45), 50, make_shared<dielectric>(1.5)));
    world.add(make_shared<sphere>(
        point3(0, 150, 145), 50, make_shared<metal>(color(0.8, 0.8, 0.9), 1.0)
    ));

    auto boundary = make_shared<sphere>(point3(360,150,145), 70, make_shared<dielectric>(1.5));
    world.add(boundary);
    world.add(make_shared<constant_medium>(boundary, 0.2, color(0.2, 0.4, 0.9)));
    boundary = make_shared<sphere>(point3(0,0,0), 5000, make_shared<dielectric>(1.5));
    world.add(make_shared<constant_medium>(boundary, .0001, color(1,1,1)));

    auto emat = make_shared<lambertian>(make_shared<image_texture>("earthmap.jpg"));
    world.add(make_shared<sphere>(point3(400,200,400), 100, emat));
    auto pertext = make_shared<noise_texture>(0.2);
    world.add(make_shared<sphere>(point3(220,280,300), 80, make_shared<lambertian>(pertext)));

    hittable_list boxes2;
    auto white = make_shared<lambertian>(color(.73, .73, .73));
    int ns = 1000;
    for (int j = 0; j < ns; j++) {
        boxes2.add(make_shared<sphere>(point3::random(0,165), 10, white));
    }

    world.add(make_shared<translate>(
        make_shared<rotate_y>(
            make_shared<bvh_node>(boxes2), 15),
            vec3(-100,270,395)
        )
    );

    camera cam;

    cam.aspect_ratio      = 1.0;
    cam.image_width       = image_width;
    cam.samples_per_pixel = samples_per_pixel;
    cam.max_depth         = max_depth;
    cam.background        = color(0,0,0);

    cam.vfov     = 40;
    cam.lookfrom = point3(478, 278, -600);
    cam.lookat   = point3(278, 278, 0);
    cam.vup      = vec3(0,1,0);

    cam.defocus_angle = 0;

    cam.render(world);
}